

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O1

Data128 Centaurus::pack_charclass(CharClass<unsigned_char> *cc)

{
  pointer pRVar1;
  ulong uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  uchar uVar5;
  int8_t iVar6;
  uchar uVar7;
  long lVar8;
  Data128 d128;
  
  pRVar1 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(cc->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 4;
  lVar3 = 0;
  uVar4 = 0;
  do {
    if (uVar4 < uVar2) {
      uVar5 = (&pRVar1->m_start)[lVar3 * 8];
      uVar7 = (&pRVar1->m_end)[lVar3 * 8];
    }
    else {
      uVar5 = '\0';
      uVar7 = '\0';
    }
    if (uVar5 == uVar7) {
      d128.sb[lVar3] = -1;
      iVar6 = '\0';
      lVar8 = uVar4 * 2;
    }
    else {
      if (uVar4 < uVar2) {
        uVar5 = (&pRVar1->m_start)[lVar3 * 8];
      }
      else {
        uVar5 = '\0';
      }
      d128.sb[lVar3] = uVar5;
      iVar6 = -1;
      lVar8 = lVar3;
      if (uVar4 < uVar2) {
        iVar6 = (&pRVar1->m_end)[lVar3 * 8] + 0xff;
      }
    }
    d128.sb[lVar8 + 1] = iVar6;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x10);
  return d128;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<unsigned char>& cc)
{
	asmjit::Data128 d128;

	for (int i = 0; i < 8; i++)
	{
		if (cc[i].empty())
		{
			d128.ub[i * 2 + 0] = 0xFF;
			d128.ub[i * 2 + 1] = 0;
		}
		else
		{
			d128.ub[i * 2 + 0] = cc[i].start();
			d128.ub[i * 2 + 1] = cc[i].end() - 1;
		}
	}

	return d128;
}